

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O0

void double_computeInvPow5(uint32_t i,uint64_t *result)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int32_t iVar8;
  int32_t iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  uint128_t shiftedSum;
  byte local_5c;
  ulong uStack_58;
  uint32_t delta;
  uint128_t b2;
  uint128_t b0;
  uint64_t m;
  uint64_t *mul;
  uint32_t offset;
  uint32_t base2;
  uint32_t base;
  uint64_t *result_local;
  uint32_t i_local;
  
  uVar6 = (i + 0x19) / 0x1a;
  uVar7 = uVar6 * 0x1a - i;
  if (uVar7 == 0) {
    *result = DOUBLE_POW5_INV_SPLIT2[uVar6][0];
    result[1] = DOUBLE_POW5_INV_SPLIT2[uVar6][1];
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = DOUBLE_POW5_TABLE[uVar7];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = DOUBLE_POW5_INV_SPLIT2[uVar6][0] - 1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = DOUBLE_POW5_TABLE[uVar7];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = DOUBLE_POW5_INV_SPLIT2[uVar6][1];
    iVar8 = pow5bits(uVar6 * 0x1a);
    iVar9 = pow5bits(i);
    b2._8_8_ = SUB168(auVar1 * auVar3,0);
    b0._0_8_ = SUB168(auVar1 * auVar3,8);
    local_5c = (byte)(iVar8 - iVar9);
    uVar10 = (ulong)b0 >> (local_5c & 0x3f);
    bVar15 = (iVar8 - iVar9 & 0x40U) != 0;
    uVar11 = b2._8_8_ >> (local_5c & 0x3f) | (ulong)b0 << 0x40 - (local_5c & 0x3f);
    if (bVar15) {
      uVar11 = uVar10;
    }
    if (bVar15) {
      uVar10 = 0;
    }
    uStack_58 = SUB168(auVar2 * auVar4,0);
    b2._0_8_ = SUB168(auVar2 * auVar4,8);
    local_5c = 0x40 - local_5c;
    uVar13 = uStack_58 << (local_5c & 0x3f);
    uVar14 = uVar13;
    uVar5 = (long)b2 << (local_5c & 0x3f) | uStack_58 >> 0x40 - (local_5c & 0x3f);
    if ((local_5c & 0x40) != 0) {
      uVar14 = 0;
      uVar5 = uVar13;
    }
    uVar12 = (ulong)(POW5_INV_OFFSETS[i >> 4] >> ((byte)i & 0xf) * '\x02' & 3);
    uVar13 = uVar11 + uVar14 + uVar12;
    *result = uVar13 + 1;
    result[1] = uVar10 + uVar5 + (ulong)CARRY8(uVar11,uVar14) +
                (ulong)CARRY8(uVar11 + uVar14,uVar12) + (ulong)(0xfffffffffffffffe < uVar13);
  }
  return;
}

Assistant:

static inline void double_computeInvPow5(const uint32_t i, uint64_t* const result) {
	const uint32_t base = (i + POW5_TABLE_SIZE - 1) / POW5_TABLE_SIZE;
	const uint32_t base2 = base * POW5_TABLE_SIZE;
	const uint32_t offset = base2 - i;
	const uint64_t* const mul = DOUBLE_POW5_INV_SPLIT2[base]; // 1/5^base2
	if (offset == 0) {
		result[0] = mul[0];
		result[1] = mul[1];
		return;
	}
	const uint64_t m = DOUBLE_POW5_TABLE[offset]; // 5^offset
	const uint128_t b0 = ((uint128_t) m) * (mul[0] - 1);
	const uint128_t b2 = ((uint128_t) m) * mul[1]; // 1/5^base2 * 5^offset = 1/5^(base2-offset) = 1/5^i
	const uint32_t delta = pow5bits(base2) - pow5bits(i);
	const uint128_t shiftedSum =
	    ((b0 >> delta) + (b2 << (64 - delta))) + 1 + ((POW5_INV_OFFSETS[i / 16] >> ((i % 16) << 1)) & 3);
	result[0] = (uint64_t) shiftedSum;
	result[1] = (uint64_t) (shiftedSum >> 64);
}